

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

int stbtt_PackFontRangesGatherRects
              (stbtt_pack_context *spc,stbtt_fontinfo *info,stbtt_pack_range *ranges,int num_ranges,
              stbrp_rect *rects)

{
  int glyph_00;
  int local_64;
  float local_60;
  int glyph;
  int codepoint;
  int y1;
  int x1;
  int y0;
  int x0;
  float scale;
  float fh;
  int k;
  int j;
  int i;
  stbrp_rect *rects_local;
  stbtt_pack_range *psStack_20;
  int num_ranges_local;
  stbtt_pack_range *ranges_local;
  stbtt_fontinfo *info_local;
  stbtt_pack_context *spc_local;
  
  scale = 0.0;
  _j = rects;
  rects_local._4_4_ = num_ranges;
  psStack_20 = ranges;
  ranges_local = (stbtt_pack_range *)info;
  info_local = (stbtt_fontinfo *)spc;
  for (k = 0; k < rects_local._4_4_; k = k + 1) {
    x0 = (int)psStack_20[k].font_size;
    if ((float)x0 <= 0.0) {
      local_60 = stbtt_ScaleForMappingEmToPixels((stbtt_fontinfo *)ranges_local,-(float)x0);
    }
    else {
      local_60 = stbtt_ScaleForPixelHeight((stbtt_fontinfo *)ranges_local,(float)x0);
    }
    y0 = (int)local_60;
    psStack_20[k].h_oversample = (uchar)info_local->glyf;
    psStack_20[k].v_oversample = (uchar)info_local->hhea;
    for (fh = 0.0; (int)fh < psStack_20[k].num_chars; fh = (float)((int)fh + 1)) {
      if (psStack_20[k].array_of_unicode_codepoints == (int *)0x0) {
        local_64 = psStack_20[k].first_unicode_codepoint_in_range + (int)fh;
      }
      else {
        local_64 = psStack_20[k].array_of_unicode_codepoints[(int)fh];
      }
      glyph_00 = stbtt_FindGlyphIndex((stbtt_fontinfo *)ranges_local,local_64);
      stbtt_GetGlyphBitmapBoxSubpixel
                ((stbtt_fontinfo *)ranges_local,glyph_00,(float)y0 * (float)(uint)info_local->glyf,
                 (float)y0 * (float)(uint)info_local->hhea,0.0,0.0,&x1,&y1,&codepoint,&glyph);
      _j[(int)scale].w = (codepoint - x1) + info_local->head + info_local->glyf + -1;
      _j[(int)scale].h = (glyph - y1) + info_local->head + info_local->hhea + -1;
      scale = (float)((int)scale + 1);
    }
  }
  return (int)scale;
}

Assistant:

STBTT_DEF int stbtt_PackFontRangesGatherRects(stbtt_pack_context *spc, stbtt_fontinfo *info, stbtt_pack_range *ranges, int num_ranges, stbrp_rect *rects)
{
   int i,j,k;

   k=0;
   for (i=0; i < num_ranges; ++i) {
      float fh = ranges[i].font_size;
      float scale = fh > 0 ? stbtt_ScaleForPixelHeight(info, fh) : stbtt_ScaleForMappingEmToPixels(info, -fh);
      ranges[i].h_oversample = (unsigned char) spc->h_oversample;
      ranges[i].v_oversample = (unsigned char) spc->v_oversample;
      for (j=0; j < ranges[i].num_chars; ++j) {
         int x0,y0,x1,y1;
         int codepoint = ranges[i].array_of_unicode_codepoints == NULL ? ranges[i].first_unicode_codepoint_in_range + j : ranges[i].array_of_unicode_codepoints[j];
         int glyph = stbtt_FindGlyphIndex(info, codepoint);
         stbtt_GetGlyphBitmapBoxSubpixel(info,glyph,
                                         scale * spc->h_oversample,
                                         scale * spc->v_oversample,
                                         0,0,
                                         &x0,&y0,&x1,&y1);
         rects[k].w = (stbrp_coord) (x1-x0 + spc->padding + spc->h_oversample-1);
         rects[k].h = (stbrp_coord) (y1-y0 + spc->padding + spc->v_oversample-1);
         ++k;
      }
   }

   return k;
}